

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

bool __thiscall
Rml::DataViewText::Initialize
          (DataViewText *this,DataModel *model,Element *element,String *param_3,String *param_4)

{
  pointer pcVar1;
  long lVar2;
  DataExpressionPtr this_00;
  bool bVar3;
  String *pSVar4;
  char *pcVar5;
  DataExpression *this_01;
  ElementText *this_02;
  char c;
  char previous;
  size_type sVar6;
  byte bVar7;
  bool in_brackets;
  bool in_string;
  DataEntry entry;
  DataExpressionInterface expression_interface;
  bool local_10b;
  byte local_10a;
  bool local_109;
  long local_108;
  _Head_base<0UL,_Rml::DataExpression_*,_false> local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  String *local_d8;
  DataViewText *local_d0;
  long local_c8;
  String *local_c0;
  DataEntry local_b8;
  String local_80;
  Vector<DataEntry> *local_60;
  pointer local_58;
  size_type local_50;
  DataExpressionInterface local_48;
  
  if ((element == (Element *)0x0) ||
     (this_02 = (ElementText *)element,
     (element->super_ScriptInterface).super_Releasable._vptr_Releasable !=
     (_func_int **)&PTR__ElementText_00335bc8)) {
    this_02 = (ElementText *)0x0;
  }
  if (this_02 != (ElementText *)0x0) {
    pSVar4 = ElementText::GetText_abi_cxx11_(this_02);
    local_d8 = &this->text;
    ::std::__cxx11::string::reserve((ulong)local_d8);
    DataExpressionInterface::DataExpressionInterface(&local_48,model,element,(Event *)0x0);
    c = '\0';
    local_10b = false;
    local_109 = false;
    local_50 = pSVar4->_M_string_length;
    bVar7 = local_50 == 0;
    local_d0 = this;
    if (!(bool)bVar7) {
      local_58 = (pSVar4->_M_dataplus)._M_p;
      local_60 = &this->data_entries;
      sVar6 = 0;
      local_c8 = 0;
      local_108 = 0;
      local_c0 = pSVar4;
      previous = '\0';
      do {
        local_10a = bVar7;
        bVar3 = local_10b;
        c = local_58[sVar6];
        pcVar5 = XMLParseTools::ParseDataBrackets(&local_10b,&local_109,c,previous);
        lVar2 = local_108;
        if (pcVar5 == (char *)0x0) {
          if (bVar3 == false) {
            if (local_10b == false) goto LAB_002052ad;
            local_c8 = local_108;
            local_108 = lVar2;
          }
          else if (local_10b == false) {
            local_b8.data_expression._M_t.
            super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
            .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Rml::DataExpression,_std::default_delete<Rml::DataExpression>,_true,_true>
                  )(__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>)
                   0x0;
            local_b8.value._M_dataplus._M_p = (pointer)&local_b8.value.field_2;
            local_b8.value._M_string_length = 0;
            local_b8.value.field_2._M_local_buf[0] = '\0';
            local_b8.index = (local_d0->text)._M_string_length;
            pcVar1 = (local_c0->_M_dataplus)._M_p;
            local_f8 = &local_e8;
            ::std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_f8,pcVar1 + local_c8 + 1,pcVar1 + local_108 + -1);
            this_01 = (DataExpression *)operator_new(0x50);
            if (local_f8 == &local_e8) {
              local_80.field_2._8_8_ = local_e8._8_8_;
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            }
            else {
              local_80._M_dataplus._M_p = (pointer)local_f8;
            }
            local_80.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
            local_80.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
            local_80._M_string_length = local_f0;
            local_f0 = 0;
            local_e8._M_local_buf[0] = '\0';
            local_f8 = &local_e8;
            DataExpression::DataExpression(this_01,&local_80);
            local_100._M_head_impl = this_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            this_00._M_t.
            super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
            .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl =
                 local_b8.data_expression._M_t.
                 super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                 .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
            local_b8.data_expression._M_t.
            super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
            .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Rml::DataExpression,_std::default_delete<Rml::DataExpression>,_true,_true>
                  )(__uniq_ptr_data<Rml::DataExpression,_std::default_delete<Rml::DataExpression>,_true,_true>
                    )local_100._M_head_impl;
            local_100._M_head_impl = (DataExpression *)0x0;
            if (this_00._M_t.
                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>)0x0
               ) {
              DataExpression::~DataExpression
                        ((DataExpression *)
                         this_00._M_t.
                         super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                         .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl);
              operator_delete((void *)this_00._M_t.
                                      super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                                      .super__Head_base<0UL,_Rml::DataExpression_*,_false>.
                                      _M_head_impl,0x50);
            }
            ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::
            ~unique_ptr((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                         *)&local_100);
            if (local_f8 != &local_e8) {
              operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,
                                                local_e8._M_local_buf[0]) + 1);
            }
            ::std::__cxx11::string::_M_replace
                      ((ulong)&local_b8.value,0,(char *)local_b8.value._M_string_length,0x2d693f);
            bVar3 = DataExpression::Parse
                              ((DataExpression *)
                               local_b8.data_expression._M_t.
                               super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                               .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,
                               &local_48,false);
            if (bVar3) {
              ::std::
              vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::
              emplace_back<Rml::DataViewText::DataEntry>(local_60,&local_b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8.value._M_dataplus._M_p != &local_b8.value.field_2) {
              operator_delete(local_b8.value._M_dataplus._M_p,
                              CONCAT71(local_b8.value.field_2._M_allocated_capacity._1_7_,
                                       local_b8.value.field_2._M_local_buf[0]) + 1);
            }
            ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::
            ~unique_ptr(&local_b8.data_expression);
            c = '\0';
            local_108 = lVar2;
          }
          else {
LAB_002052ad:
            local_108 = lVar2;
            if ((previous != '\0') && (local_10b == false)) {
              ::std::__cxx11::string::push_back((char)local_d8);
            }
          }
          local_108 = local_108 + 1;
        }
        else {
          Log::Message(LT_WARNING,"Failed to parse data view text \'%s\'. %s",
                       (local_c0->_M_dataplus)._M_p,pcVar5);
          c = previous;
        }
        bVar7 = local_10a;
        if (pcVar5 != (char *)0x0) break;
        sVar6 = sVar6 + 1;
        bVar7 = local_50 == sVar6;
        previous = c;
      } while (!(bool)bVar7);
    }
    if ((bVar7 & 1) != 0) {
      if ((c != '\0') && (local_10b == false)) {
        ::std::__cxx11::string::push_back((char)local_d8);
      }
      return (local_d0->data_entries).
             super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (local_d0->data_entries).
             super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return false;
}

Assistant:

bool DataViewText::Initialize(DataModel& model, Element* element, const String& /*expression*/, const String& /*modifier*/)
{
	ElementText* element_text = rmlui_dynamic_cast<ElementText*>(element);
	if (!element_text)
		return false;

	const String& in_text = element_text->GetText();

	text.reserve(in_text.size());

	DataExpressionInterface expression_interface(&model, element);

	size_t begin_brackets = 0;
	size_t cur = 0;
	char previous = 0;
	bool was_in_brackets = false;
	bool in_brackets = false;
	bool in_string = false;

	for (char c : in_text)
	{
		was_in_brackets = in_brackets;

		const char* error_str = XMLParseTools::ParseDataBrackets(in_brackets, in_string, c, previous);
		if (error_str)
		{
			Log::Message(Log::LT_WARNING, "Failed to parse data view text '%s'. %s", in_text.c_str(), error_str);
			return false;
		}

		if (!was_in_brackets && in_brackets)
		{
			begin_brackets = cur;
		}
		else if (was_in_brackets && !in_brackets)
		{
			DataEntry entry;
			entry.index = text.size();
			entry.data_expression = MakeUnique<DataExpression>(String(in_text.begin() + begin_brackets + 1, in_text.begin() + cur - 1));
			entry.value = "#rmlui#"; // A random value that the user string will not be initialized with.

			if (entry.data_expression->Parse(expression_interface, false))
				data_entries.push_back(std::move(entry));

			// Reset char so that it won't be appended to the output
			c = 0;
		}
		else if (!in_brackets && previous)
		{
			text.push_back(previous);
		}

		cur++;
		previous = c;
	}

	if (!in_brackets && previous)
	{
		text.push_back(previous);
	}

	if (data_entries.empty())
		return false;

	return true;
}